

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

void expect_(TestReporter *test_reporter,char *function,char *test_file,int test_line,...)

{
  _Bool _Var1;
  int iVar2;
  RecordedExpectation *pRVar3;
  int *piVar4;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Constraint *constraint;
  int i;
  CgreenVector *constraints_vector;
  RecordedExpectation *expectation;
  va_list constraints;
  CgreenVector *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int iVar5;
  char *in_stack_fffffffffffffef8;
  __va_list_tag *in_stack_ffffffffffffff00;
  __va_list_tag *in_stack_ffffffffffffff10;
  int local_4c;
  
  _Var1 = have_always_expectation_for(in_stack_fffffffffffffef8);
  if (_Var1) {
    (**(code **)(in_RDI + 0x38))
              (in_RDI,in_RDX,in_ECX,0,
               "Mocked function [%s] already has an expectation that it will always be called a certain way; any expectations declared after an always expectation are invalid"
               ,in_RSI);
    destroy_constraints(in_stack_ffffffffffffff00);
  }
  else {
    _Var1 = have_never_call_expectation_for(in_stack_fffffffffffffef8);
    if (_Var1) {
      remove_never_call_expectation_for((char *)in_stack_ffffffffffffff00);
      (**(code **)(in_RDI + 0x38))
                (in_RDI,in_RDX,in_ECX,0,
                 "Mocked function [%s] already has an expectation that it will never be called; any expectations declared after a never call expectation are invalid"
                 ,in_RSI);
      destroy_constraints(in_stack_ffffffffffffff00);
    }
    else {
      constraints_vector_from_va_list(in_stack_ffffffffffffff10);
      pRVar3 = create_recorded_expectation
                         ((char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
      pRVar3->time_to_live = 1;
      local_4c = 0;
      while (iVar5 = local_4c, iVar2 = cgreen_vector_size(pRVar3->constraints), iVar5 < iVar2) {
        piVar4 = (int *)cgreen_vector_get(in_stack_fffffffffffffee8,0);
        if ((piVar4 != (int *)0x0) && (*piVar4 == 8)) {
          pRVar3->time_to_live = (int)*(undefined8 *)(piVar4 + 0x12);
          break;
        }
        local_4c = local_4c + 1;
      }
      cgreen_vector_add((CgreenVector *)CONCAT44(iVar5,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffee8);
    }
  }
  return;
}

Assistant:

void expect_(TestReporter* test_reporter, const char *function, const char *test_file, int test_line, ...) {
    va_list constraints;
    RecordedExpectation *expectation;
    CgreenVector *constraints_vector;

    if (have_always_expectation_for(function)) {
        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation that it will always be called a certain way; "
                "any expectations declared after an always expectation are invalid", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }

    if (have_never_call_expectation_for(function)) {
        remove_never_call_expectation_for(function);

        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation that it will never be called; "
                "any expectations declared after a never call expectation are invalid", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }


    va_start(constraints, test_line);
    constraints_vector = constraints_vector_from_va_list(constraints);
    expectation = create_recorded_expectation(function, test_file, test_line, constraints_vector);
    va_end(constraints);

    expectation->time_to_live = 1;
    for (int i = 0 ; i < cgreen_vector_size(expectation->constraints) ; i++) {
        Constraint * constraint = cgreen_vector_get(expectation->constraints, i);
        if (constraint && constraint->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
            expectation->time_to_live = (int)constraint->expected_value.value.integer_value;
            break;
        }
    }
    cgreen_vector_add(global_expectation_queue, expectation);
}